

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareReplacedStrings(xmlChar *x,xmlChar *y)

{
  bool bVar1;
  byte *pbStack_20;
  int tmp;
  xmlChar *y_local;
  xmlChar *x_local;
  
  pbStack_20 = y;
  y_local = x;
  do {
    bVar1 = false;
    if (*y_local != '\0') {
      bVar1 = *pbStack_20 != 0;
    }
    if (!bVar1) {
      if (*y_local != '\0') {
        return 1;
      }
      if (*pbStack_20 != 0) {
        return -1;
      }
      return 0;
    }
    if ((*pbStack_20 == 0x20) ||
       (((8 < *pbStack_20 && (*pbStack_20 < 0xb)) || (*pbStack_20 == 0xd)))) {
      if ((*y_local != ' ') && (((*y_local < 9 || (10 < *y_local)) && (*y_local != '\r')))) {
        if ((int)(*y_local - 0x20) < 0) {
          return -1;
        }
        return 1;
      }
    }
    else {
      if (((*y_local == ' ') || ((8 < *y_local && (*y_local < 0xb)))) || (*y_local == '\r')) {
        if ((int)(0x20 - (uint)*pbStack_20) < 0) {
          return -1;
        }
        return 1;
      }
      if ((int)((uint)*y_local - (uint)*pbStack_20) < 0) {
        return -1;
      }
      if (0 < (int)((uint)*y_local - (uint)*pbStack_20)) {
        return 1;
      }
    }
    y_local = y_local + 1;
    pbStack_20 = pbStack_20 + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaCompareReplacedStrings(const xmlChar *x,
				const xmlChar *y)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_BLANK_CH(*x)) {
		if ((*x - 0x20) < 0)
		    return(-1);
		else
		    return(1);
	    }
	} else {
	    if IS_WSP_BLANK_CH(*x) {
		if ((0x20 - *y) < 0)
		    return(-1);
		else
		    return(1);
	    }
	    tmp = *x - *y;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
	x++;
	y++;
    }
    if (*x != 0)
        return(1);
    if (*y != 0)
        return(-1);
    return(0);
}